

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

uint our_ttymode_opcode(uint real_opcode,int ssh_version)

{
  int ssh_version_local;
  uint real_opcode_local;
  
  ssh_version_local = real_opcode;
  if (ssh_version == 1) {
    if (real_opcode == 0xc0) {
      ssh_version_local = 0x100;
    }
    else if (real_opcode == 0xc1) {
      ssh_version_local = 0x101;
    }
  }
  else if (real_opcode == 0x80) {
    ssh_version_local = 0x100;
  }
  else if (real_opcode == 0x81) {
    ssh_version_local = 0x101;
  }
  return ssh_version_local;
}

Assistant:

static unsigned our_ttymode_opcode(unsigned real_opcode, int ssh_version)
{
    if (ssh_version == 1) {
        switch (real_opcode) {
          case TTYMODE_ISPEED_SSH1:
            return TTYMODE_ISPEED;
          case TTYMODE_OSPEED_SSH1:
            return TTYMODE_OSPEED;
          default:
            return real_opcode;
        }
    } else {
        switch (real_opcode) {
          case TTYMODE_ISPEED_SSH2:
            return TTYMODE_ISPEED;
          case TTYMODE_OSPEED_SSH2:
            return TTYMODE_OSPEED;
          default:
            return real_opcode;
        }
    }
}